

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_acl_text_compat(wchar_t *flags)

{
  wchar_t *flags_local;
  
  if ((*flags & 0x300U) == 0) {
    flags_local._4_4_ = L'\x01';
  }
  else {
    if ((*flags & 0x400U) != 0) {
      *flags = *flags | 1;
    }
    if ((*flags & 0x800U) != 0) {
      *flags = *flags | 2;
    }
    *flags = *flags | 8;
    flags_local._4_4_ = L'\0';
  }
  return flags_local._4_4_;
}

Assistant:

static int
archive_entry_acl_text_compat(int *flags)
{
	if ((*flags & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) == 0)
		return (1);

	/* ABI compat with old ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID */
	if ((*flags & OLD_ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID) != 0)
		*flags |= ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID;

	/* ABI compat with old ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT */
	if ((*flags & OLD_ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
		*flags |=  ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	*flags |= ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA;

	return (0);
}